

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long in_FS_OFFSET;
  InternalKey end_storage;
  InternalKey begin_storage;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ManualCompaction local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x255,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (5 < level) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x256,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_b0.tmp_storage.rep_.field_2;
  local_b0.tmp_storage.rep_._M_string_length = 0;
  local_b0.tmp_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_b0.done = false;
  local_b0.level = level;
  local_b0.tmp_storage.rep_._M_dataplus._M_p = (pointer)paVar1;
  if (begin != (Slice *)0x0) {
    InternalKey::InternalKey((InternalKey *)local_d0,begin,0xffffffffffffff,kTypeValue);
    pbVar4 = &local_58;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != &local_c0) {
      operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
    }
  }
  local_b0.begin = (InternalKey *)pbVar4;
  if (end == (Slice *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    InternalKey::InternalKey((InternalKey *)local_d0,end,0,kTypeDeletion);
    pbVar4 = &local_78;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != &local_c0) {
      operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
    }
  }
  local_b0.end = (InternalKey *)pbVar4;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    if (local_b0.done == false) {
      do {
        if ((((this->shutting_down_)._M_base._M_i & 1U) != 0) ||
           ((this->bg_error_).state_ != (char *)0x0)) break;
        if (this->manual_compaction_ == (ManualCompaction *)0x0) {
          this->manual_compaction_ = &local_b0;
          MaybeScheduleCompaction(this);
        }
        else {
          local_d0._0_8_ = (this->background_work_finished_signal_).mu_;
          local_d0[8] = true;
          std::condition_variable::wait((unique_lock *)&this->background_work_finished_signal_);
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_d0[8] = false;
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d0);
        }
      } while (local_b0.done != true);
    }
    if (this->manual_compaction_ == &local_b0) {
      this->manual_compaction_ = (ManualCompaction *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.tmp_storage.rep_._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.tmp_storage.rep_._M_dataplus._M_p,
                      CONCAT71(local_b0.tmp_storage.rep_.field_2._M_allocated_capacity._1_7_,
                               local_b0.tmp_storage.rep_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar3 = std::__throw_system_error(iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.tmp_storage.rep_._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.tmp_storage.rep_._M_dataplus._M_p,
                      CONCAT71(local_b0.tmp_storage.rep_.field_2._M_allocated_capacity._1_7_,
                               local_b0.tmp_storage.rep_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar3);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}